

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setSources
          (Program *this,string *vertSource,string *fragSource)

{
  char *fragSourceCstr;
  char *vertSourceCstr;
  
  vertSourceCstr = (vertSource->_M_dataplus)._M_p;
  fragSourceCstr = (fragSource->_M_dataplus)._M_p;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->m_fragSource);
  glwShaderSource(this->m_vertShaderGL,1,&vertSourceCstr,(GLint *)0x0);
  glwShaderSource(this->m_fragShaderGL,1,&fragSourceCstr,(GLint *)0x0);
  this->m_hasSources = true;
  return;
}

Assistant:

void Program::setSources (const string& vertSource, const string& fragSource)
{
	const char* const vertSourceCstr = vertSource.c_str();
	const char* const fragSourceCstr = fragSource.c_str();

	m_vertSource = vertSource;
	m_fragSource = fragSource;

	// \note In GLES2 api the source parameter type lacks one const.
	glShaderSource(m_vertShaderGL, 1, (const char**)&vertSourceCstr, DE_NULL);
	glShaderSource(m_fragShaderGL, 1, (const char**)&fragSourceCstr, DE_NULL);

	m_hasSources = true;
}